

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_formats.c
# Opt level: O0

CMFormat INT_CMregister_simple_format
                   (CManager cm,char *format_name,FMFieldList field_list,int struct_size)

{
  undefined8 *puVar1;
  CMFormat p_Var2;
  undefined4 in_ECX;
  CManager in_RDX;
  undefined8 in_RSI;
  FMStructDescRec *format_list;
  undefined4 in_stack_ffffffffffffffe0;
  
  puVar1 = (undefined8 *)INT_CMmalloc(CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  *puVar1 = in_RSI;
  puVar1[1] = in_RDX;
  *(undefined4 *)(puVar1 + 2) = in_ECX;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  *(undefined4 *)(puVar1 + 6) = 0;
  puVar1[7] = 0;
  p_Var2 = INT_CMregister_format
                     (in_RDX,(FMStructDescList)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  return p_Var2;
}

Assistant:

CMFormat
INT_CMregister_simple_format(CManager cm, char *format_name, FMFieldList field_list, int struct_size)
{
  FMStructDescRec *format_list = malloc(sizeof(*format_list) * 2);
  /* NOTE:  This is a memory leak as we do not, by design, deallocate the format_list */
  format_list[0].format_name = format_name;
  format_list[0].field_list = field_list;
  format_list[0].struct_size = struct_size;
  format_list[0].opt_info = NULL;
  format_list[1].format_name = NULL;
  format_list[1].field_list = NULL;
  format_list[1].struct_size = 0;
  format_list[1].opt_info = NULL;
  return INT_CMregister_format(cm, &format_list[0]);
}